

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::ObserveEventsRequest::ParseFromArray
          (ObserveEventsRequest *this,void *raw,size_t size)

{
  pointer pOVar1;
  uint64_t uVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t *end;
  uint uVar9;
  ulong uVar10;
  uint64_t int_value;
  uint64_t payload_length;
  uint64_t preamble;
  uint32_t local_60;
  uint16_t local_5c;
  uint8_t local_5a;
  ObserveEventsRequest *local_58;
  vector<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
  *local_50;
  bitset<2UL> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  uint64_t payload_length_1;
  
  pOVar1 = (this->events_to_observe_).
           super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->events_to_observe_).
      super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
      ._M_impl.super__Vector_impl_data._M_finish != pOVar1) {
    (this->events_to_observe_).
    super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
    ._M_impl.super__Vector_impl_data._M_finish = pOVar1;
  }
  local_50 = &this->events_to_observe_;
  local_40 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  end = (uint64_t *)(size + (long)raw);
  uVar8 = 0;
  local_58 = this;
  do {
    if (end <= raw) goto switchD_00303515_caseD_3;
    preamble = 0;
    if ((long)(char)*raw < 0) {
      puVar5 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&preamble);
      if (puVar5 != (uint64_t *)raw) goto LAB_003034dd;
LAB_00303817:
      uVar8 = 0;
      uVar6 = 0;
      goto LAB_0030361b;
    }
    puVar5 = (uint64_t *)((long)raw + 1);
    preamble = (long)(char)*raw;
LAB_003034dd:
    uVar2 = preamble;
    uVar10 = preamble >> 3;
    uVar9 = (uint)uVar10;
    if ((uVar9 == 0) || (end <= puVar5)) goto LAB_00303817;
    int_value = 0;
    switch((uint)preamble & 7) {
    case 0:
      puVar4 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar5,(uint8_t *)end,&int_value);
      uVar7 = 0;
      uVar6 = 0;
      if (puVar4 == puVar5) goto LAB_0030361b;
      break;
    case 1:
      puVar4 = puVar5 + 1;
      if (end < puVar4) goto switchD_00303515_caseD_3;
      int_value = *puVar5;
LAB_0030355f:
      uVar7 = 0;
      break;
    case 2:
      puVar3 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar5,(uint8_t *)end,&payload_length)
      ;
      if ((puVar3 == puVar5) || ((ulong)((long)end - (long)puVar3) < payload_length))
      goto switchD_00303515_caseD_3;
      puVar4 = (uint64_t *)((long)puVar3 + payload_length);
      uVar7 = payload_length;
      int_value = (uint64_t)puVar3;
      break;
    default:
      goto switchD_00303515_caseD_3;
    case 5:
      puVar4 = (uint64_t *)((long)puVar5 + 4);
      if (puVar4 <= end) {
        int_value = (uint64_t)(uint)*puVar5;
        goto LAB_0030355f;
      }
      goto switchD_00303515_caseD_3;
    }
    raw = puVar4;
  } while ((0xffff < uVar9) || (0xfffffff < uVar7));
  uVar8 = uVar7 | (uVar2 & 7) << 0x30 | uVar10 << 0x20;
  uVar6 = int_value;
LAB_0030361b:
  local_48 = &local_58->_has_field_;
LAB_00303631:
  do {
    preamble = uVar6;
    local_60 = (uint32_t)uVar8;
    local_5a = (uint8_t)(uVar8 >> 0x30);
    local_5c = (uint16_t)(uVar8 >> 0x20);
    if (local_5c == 1) {
      std::bitset<2UL>::set(local_48,1,true);
      if (local_5c != 1) goto LAB_0030368f;
      std::
      vector<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
      ::emplace_back<>(local_50);
      (local_58->events_to_observe_).
      super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] = (ObservableEvents_Type)preamble;
    }
    else {
      if ((uVar8 & 0xffff00000000) == 0) {
        return end == (uint64_t *)raw;
      }
LAB_0030368f:
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                ((Field *)&preamble,local_40);
    }
    do {
      if (end <= raw) {
LAB_003037f6:
        uVar8 = 0;
        uVar6 = 0;
        goto LAB_00303631;
      }
      int_value = 0;
      if ((long)(char)*raw < 0) {
        puVar5 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&int_value);
        if (puVar5 == (uint64_t *)raw) goto LAB_003037f6;
      }
      else {
        puVar5 = (uint64_t *)((long)raw + 1);
        int_value = (long)(char)*raw;
      }
      uVar2 = int_value;
      uVar10 = int_value >> 3;
      uVar9 = (uint)uVar10;
      if ((uVar9 == 0) || (end <= puVar5)) goto LAB_003037f6;
      payload_length = 0;
      switch((uint)int_value & 7) {
      case 0:
        puVar4 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar5,(uint8_t *)end,&payload_length);
        uVar7 = 0;
        uVar8 = 0;
        uVar6 = 0;
        if (puVar4 == puVar5) goto LAB_00303631;
        break;
      case 1:
        puVar4 = puVar5 + 1;
        if (end < puVar4) goto switchD_00303702_caseD_3;
        payload_length = *puVar5;
LAB_00303758:
        uVar7 = 0;
        break;
      case 2:
        puVar3 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar5,(uint8_t *)end,&payload_length_1);
        if ((puVar3 == puVar5) || ((ulong)((long)end - (long)puVar3) < payload_length_1))
        goto switchD_00303702_caseD_3;
        puVar4 = (uint64_t *)((long)puVar3 + payload_length_1);
        uVar7 = payload_length_1;
        payload_length = (uint64_t)puVar3;
        break;
      default:
        goto switchD_00303702_caseD_3;
      case 5:
        puVar4 = (uint64_t *)((long)puVar5 + 4);
        if (puVar4 <= end) {
          payload_length = (uint64_t)(uint)*puVar5;
          goto LAB_00303758;
        }
        goto switchD_00303702_caseD_3;
      }
      raw = puVar4;
    } while ((0xffff < uVar9) || (0xfffffff < uVar7));
    uVar8 = uVar7 | (uVar2 & 7) << 0x30 | uVar10 << 0x20;
    uVar6 = payload_length;
  } while( true );
switchD_00303515_caseD_3:
  uVar8 = 0;
  uVar6 = 0;
  goto LAB_0030361b;
switchD_00303702_caseD_3:
  uVar8 = 0;
  uVar6 = 0;
  goto LAB_00303631;
}

Assistant:

bool ObserveEventsRequest::ParseFromArray(const void* raw, size_t size) {
  events_to_observe_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* events_to_observe */:
        events_to_observe_.emplace_back();
        field.get(&events_to_observe_.back());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}